

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromFirst
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong extraout_RDX;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char *__s;
  uint uVar10;
  VerySimpleReadOnlyString VVar11;
  
  uVar1 = find->length;
  pcVar3 = find->data;
  uVar2 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar5 = (ulong)uVar2;
  iVar8 = 0;
  uVar6 = 0;
  do {
    uVar9 = uVar6;
    if (uVar6 < uVar1) {
      uVar9 = uVar1;
    }
    uVar10 = 0;
    while( true ) {
      uVar7 = uVar1;
      if (uVar9 + iVar8 == uVar10) goto LAB_0010edd2;
      if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar10) !=
          pcVar3[uVar6 + uVar10]) break;
      uVar10 = uVar10 + 1;
      uVar7 = uVar6;
      if (uVar2 == uVar10) {
LAB_0010edd2:
        uVar6 = uVar2;
        if (in_CL != '\0') {
          uVar6 = 0;
        }
        __s = "";
        if (in_CL != '\0') {
          __s = pcVar3;
        }
        if (uVar1 - uVar7 == 0) {
          uVar9 = 0;
          if (in_CL != '\0') {
            uVar9 = uVar1;
          }
        }
        else {
          uVar9 = uVar1 - uVar7;
          __s = pcVar3 + (uVar6 + uVar7);
          if (in_CL == '\0') {
            uVar5 = (ulong)(uVar2 + uVar7);
            uVar9 = uVar1 - (uVar2 + uVar7);
          }
        }
        this->data = __s;
        if (uVar9 == 0xffffffff) {
          if (__s == (char *)0x0) {
            uVar9 = 0;
          }
          else {
            sVar4 = strlen(__s);
            uVar9 = (uint)sVar4;
            uVar5 = extraout_RDX;
          }
        }
        this->length = uVar9;
        VVar11._8_8_ = uVar5;
        VVar11.data = (tCharPtr)this;
        return VVar11;
      }
    }
    uVar6 = uVar6 + 1;
    iVar8 = iVar8 + -1;
  } while( true );
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromFirst(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? (includeFind ? data : "") : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (includeFind ? (unsigned int)length : 0)
	                                                      : (includeFind ? (unsigned int)length - pos
	                                                                  : (unsigned int)length - pos - (unsigned int)find.length));
	}